

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O2

void writeWithCommas(raw_ostream *S,ArrayRef<char> Buffer)

{
  size_t N;
  uint __line;
  size_t in_RCX;
  size_t __n;
  char *__assertion;
  ArrayRef<char> AVar1;
  ArrayRef<char> local_38;
  
  local_38 = Buffer;
  if (Buffer.Length == 0) {
    __assertion = "!Buffer.empty()";
    __line = 0x22;
  }
  else {
    N = (Buffer.Length - 1) % 3 + 1;
    AVar1 = llvm::ArrayRef<char>::take_front(&local_38,N);
    llvm::raw_ostream::write(S,(int)AVar1.Data,(void *)AVar1.Length,in_RCX);
    local_38 = llvm::ArrayRef<char>::drop_front(&local_38,N);
    __n = local_38.Length;
    if (__n % 3 == 0) {
      while (__n != 0) {
        llvm::raw_ostream::operator<<(S,',');
        AVar1 = llvm::ArrayRef<char>::take_front(&local_38,3);
        llvm::raw_ostream::write(S,(int)AVar1.Data,(void *)0x3,__n);
        local_38 = llvm::ArrayRef<char>::drop_front(&local_38,3);
        __n = local_38.Length;
      }
      return;
    }
    __assertion = "Buffer.size() % 3 == 0";
    __line = 0x2a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/NativeFormatting.cpp"
                ,__line,"void writeWithCommas(raw_ostream &, ArrayRef<char>)");
}

Assistant:

static void writeWithCommas(raw_ostream &S, ArrayRef<char> Buffer) {
  assert(!Buffer.empty());

  ArrayRef<char> ThisGroup;
  int InitialDigits = ((Buffer.size() - 1) % 3) + 1;
  ThisGroup = Buffer.take_front(InitialDigits);
  S.write(ThisGroup.data(), ThisGroup.size());

  Buffer = Buffer.drop_front(InitialDigits);
  assert(Buffer.size() % 3 == 0);
  while (!Buffer.empty()) {
    S << ',';
    ThisGroup = Buffer.take_front(3);
    S.write(ThisGroup.data(), 3);
    Buffer = Buffer.drop_front(3);
  }
}